

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
* __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::within
          (vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
           *__return_storage_ptr__,KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *low,
          Vector2<long> *high)

{
  ulong uVar1;
  bool bVar2;
  out_of_range *this_00;
  reference ppNVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 local_b8 [6];
  bool high_greater;
  bool low_less;
  ulong local_a0;
  size_t dim;
  Node *n;
  undefined1 local_88 [8];
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  level_nodes;
  Vector2<long> *high_local;
  Vector2<long> *low_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  *ret;
  
  if (this->root == (Node *)0x0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"no such item");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
           *)local_88);
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
  ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
            ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
              *)local_88,&this->root);
  n._7_1_ = 0;
  ::std::
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  ::vector(__return_storage_ptr__);
  do {
    bVar2 = ::std::
            deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            ::empty((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                     *)local_88);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      n._7_1_ = 1;
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                *)local_88);
      return __return_storage_ptr__;
    }
    ppNVar3 = ::std::
              deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ::front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                       *)local_88);
    dim = (size_t)*ppNVar3;
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::pop_front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 *)local_88);
    for (local_a0 = 0; uVar1 = local_a0, sVar4 = Vector2<long>::dimensions(), uVar1 < sVar4;
        local_a0 = local_a0 + 1) {
      lVar5 = Vector2<long>::at((Vector2<long> *)dim,local_a0);
      lVar6 = Vector2<long>::at(low,local_a0);
      if (lVar5 < lVar6) break;
      lVar5 = Vector2<long>::at((Vector2<long> *)dim,local_a0);
      lVar6 = Vector2<long>::at(high,local_a0);
      if (lVar6 <= lVar5) break;
    }
    uVar1 = local_a0;
    sVar4 = Vector2<long>::dimensions();
    if (uVar1 == sVar4) {
      ::std::make_pair<phosg::Vector2<long>&,long&>
                ((pair<phosg::Vector2<long>,_long> *)local_b8,(Vector2<long> *)dim,
                 (long *)(dim + 0x30));
      ::std::
      vector<std::pair<phosg::Vector2<long>,long>,std::allocator<std::pair<phosg::Vector2<long>,long>>>
      ::emplace_back<std::pair<phosg::Vector2<long>,long>>
                ((vector<std::pair<phosg::Vector2<long>,long>,std::allocator<std::pair<phosg::Vector2<long>,long>>>
                  *)__return_storage_ptr__,(pair<phosg::Vector2<long>,_long> *)local_b8);
    }
    lVar5 = Vector2<long>::at(low,*(size_t *)(dim + 0x10));
    lVar6 = Vector2<long>::at((Vector2<long> *)dim,*(size_t *)(dim + 0x10));
    lVar7 = Vector2<long>::at(high,*(size_t *)(dim + 0x10));
    lVar8 = Vector2<long>::at((Vector2<long> *)dim,*(size_t *)(dim + 0x10));
    if ((lVar5 < lVar6) && (*(long *)(dim + 0x18) != 0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)local_88,(Node **)(dim + 0x18));
    }
    if ((lVar8 <= lVar7) && (*(long *)(dim + 0x20) != 0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)local_88,(Node **)(dim + 0x20));
    }
  } while( true );
}

Assistant:

typename std::vector<std::pair<CoordType, ValueType>>
KDTree<CoordType, ValueType>::within(
    const CoordType& low, const CoordType& high) const {
  if (this->root == nullptr) {
    throw std::out_of_range("no such item");
  }

  std::deque<Node*> level_nodes;
  level_nodes.emplace_back(this->root);
  std::vector<std::pair<CoordType, ValueType>> ret;
  while (!level_nodes.empty()) {
    Node* n = level_nodes.front();
    level_nodes.pop_front();

    // if this node is within the range, return it
    {
      size_t dim;
      for (dim = 0; dim < CoordType::dimensions(); dim++) {
        if ((n->pt.at(dim) < low.at(dim)) ||
            (n->pt.at(dim) >= high.at(dim))) {
          break;
        }
      }
      if (dim == CoordType::dimensions()) {
        ret.emplace_back(std::make_pair(n->pt, n->value));
      }
    }

    // if the range falls entirely on one side of the node, move down to that
    // node. otherwise, move down to both nodes
    bool low_less = (low.at(n->dim) < n->pt.at(n->dim));
    bool high_greater = (high.at(n->dim) >= n->pt.at(n->dim));
    if (low_less && n->before) {
      level_nodes.emplace_back(n->before);
    }
    if (high_greater && n->after_or_equal) {
      level_nodes.emplace_back(n->after_or_equal);
    }
  }
  return ret;
}